

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

size_t EmitArgsWithArgOutsAtEnd
                 (ParseNode *pnode,BOOL fAssignRegs,ByteCodeGenerator *byteCodeGenerator,
                 FuncInfo *funcInfo,ProfileId callSiteId,RegSlot thisLocation,
                 ArgSlot argsCountForStartCall,bool emitProfiledArgouts,
                 AuxArray<unsigned_int> *spreadIndices)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot RVar4;
  RegSlot argTempLocation;
  undefined4 *puVar5;
  ParseNodeBin *pPVar6;
  RegSlot reg;
  ushort uVar7;
  uint uVar8;
  ByteCodeWriter *this;
  ulong uVar10;
  ArgSlot local_34;
  ArgSlot local_32 [3];
  ArgSlot spreadIndex;
  ArgSlot argIndex;
  uint uVar9;
  
  if (pnode == (ParseNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1d3a,"(pnode != nullptr)","pnode != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  local_32[0] = 0;
  local_34 = 0;
  RVar4 = FuncInfo::AcquireTmpRegister(funcInfo);
  OVar1 = pnode->nop;
  argTempLocation = RVar4;
  while (OVar1 == knopList) {
    pPVar6 = ParseNode::AsParseNodeBin(pnode);
    EmitOneArg(pPVar6->pnode1,fAssignRegs,byteCodeGenerator,funcInfo,callSiteId,local_32,&local_34,
               argTempLocation,false,spreadIndices);
    pPVar6 = ParseNode::AsParseNodeBin(pnode);
    pnode = pPVar6->pnode2;
    argTempLocation = FuncInfo::AcquireTmpRegister(funcInfo);
    OVar1 = pnode->nop;
  }
  EmitOneArg(pnode,fAssignRegs,byteCodeGenerator,funcInfo,callSiteId,local_32,&local_34,
             argTempLocation,false,spreadIndices);
  this = &byteCodeGenerator->m_writer;
  Js::ByteCodeWriter::StartCall(this,StartCall,argsCountForStartCall);
  if (thisLocation != 0xffffffff) {
    Js::ByteCodeWriter::ArgOut<true>(this,0,thisLocation,callSiteId,false);
  }
  uVar7 = local_32[0];
  uVar10 = (ulong)local_32[0];
  if (local_32[0] != 0) {
    uVar8 = 0;
    do {
      reg = RVar4 + uVar8;
      uVar8 = uVar8 + 1;
      Js::ByteCodeWriter::ArgOut<true>(this,(ArgSlot)uVar8,reg,callSiteId,emitProfiledArgouts);
      uVar9 = (uint)uVar7;
    } while (uVar9 != uVar8);
    while (uVar7 != 0) {
      FuncInfo::ReleaseTmpRegister(funcInfo,argTempLocation);
      uVar7 = (short)uVar9 - 1;
      uVar9 = (uint)uVar7;
      argTempLocation = argTempLocation - 1;
    }
  }
  return uVar10;
}

Assistant:

size_t EmitArgsWithArgOutsAtEnd(
    ParseNode *pnode,
    BOOL fAssignRegs,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    Js::ProfileId callSiteId,
    Js::RegSlot thisLocation,
    Js::ArgSlot argsCountForStartCall,
    bool emitProfiledArgouts,
    Js::AuxArray<uint32> *spreadIndices = nullptr
)
{
    AssertOrFailFast(pnode != nullptr);

    Js::ArgSlot argIndex = 0;
    Js::ArgSlot spreadIndex = 0;

    Js::RegSlot argTempLocation = funcInfo->AcquireTmpRegister();
    Js::RegSlot firstArgTempLocation = argTempLocation;

    while (pnode->nop == knopList)
    {
        EmitOneArg(pnode->AsParseNodeBin()->pnode1, fAssignRegs, byteCodeGenerator, funcInfo, callSiteId, argIndex, spreadIndex, argTempLocation, false /*emitProfiledArgout*/, spreadIndices);
        pnode = pnode->AsParseNodeBin()->pnode2;
        argTempLocation = funcInfo->AcquireTmpRegister();
    }

    EmitOneArg(pnode, fAssignRegs, byteCodeGenerator, funcInfo, callSiteId, argIndex, spreadIndex, argTempLocation, false /*emitProfiledArgout*/, spreadIndices);

    byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, argsCountForStartCall);

    // Emit all argOuts now

    if (thisLocation != Js::Constants::NoRegister)
    {
        // Emit the "this" object.
        byteCodeGenerator->Writer()->ArgOut<true>(0, thisLocation, callSiteId, false /*emitProfiledArgouts*/);
    }

    for (Js::ArgSlot index = 0; index < argIndex; index++)
    {
        byteCodeGenerator->Writer()->ArgOut<true>(index + 1, firstArgTempLocation + index, callSiteId, emitProfiledArgouts);
    }

    // Now release all those temps register
    for (Js::ArgSlot index = argIndex; index > 0; index--)
    {
        funcInfo->ReleaseTmpRegister(argTempLocation--);
    }

    return argIndex;
}